

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNErrCode SUNMemoryHelper_Destroy(SUNMemoryHelper helper)

{
  void *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  SUNErrCode err;
  SUNErrCode local_14;
  SUNErrCode local_4;
  
  local_14 = 0;
  if (in_RDI == (void *)0x0) {
    local_4 = 0;
  }
  else {
    if (*(long *)(*(long *)((long)in_RDI + 0x10) + 0x38) == 0) {
      free(*(void **)((long)in_RDI + 0x10));
      free(in_RDI);
    }
    else {
      local_14 = (**(code **)(*(long *)((long)in_RDI + 0x10) + 0x38))(in_RDI);
    }
    local_4 = local_14;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNMemoryHelper_Destroy(SUNMemoryHelper helper)
{
  SUNErrCode err = SUN_SUCCESS;
  SUNFunctionBegin(helper->sunctx);

  if (!helper) { return err; }

  if (helper->content)
  {
    SUNAssert(helper->ops->destroy, SUN_ERR_NOT_IMPLEMENTED);
  }

  if (helper->ops->destroy)
  {
    /* user helper defined destroy */
    err = helper->ops->destroy(helper);
  }
  else
  {
    /* default destroy */
    free(helper->ops);
    free(helper);
  }

  return err;
}